

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

Expression __thiscall
dynet::BidirectionalTreeLSTMBuilder::add_input
          (BidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  uint *puVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  uint *puVar3;
  ulong uVar4;
  bool bVar5;
  RNNPointer prev;
  Expression embedding;
  RNNPointer local_8c;
  Expression *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_78;
  initializer_list<dynet::Expression> local_70;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  
  local_8c = -1;
  local_88 = x;
  local_50 = RNNBuilder::add_input(&(this->fwd_node_builder).super_RNNBuilder,&local_8c,x);
  local_8c = (this->fwd_node_builder).super_RNNBuilder.cur;
  puVar1 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  local_78 = &this->h;
  local_80 = children;
  for (puVar3 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_50 = RNNBuilder::add_input
                         (&(this->fwd_node_builder).super_RNNBuilder,&local_8c,
                          (this->h).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start + *puVar3);
    local_8c = (this->fwd_node_builder).super_RNNBuilder.cur;
  }
  local_8c = -1;
  local_40 = RNNBuilder::add_input(&(this->rev_node_builder).super_RNNBuilder,&local_8c,local_88);
  pvVar2 = local_80;
  local_8c = (this->rev_node_builder).super_RNNBuilder.cur;
  uVar4 = (ulong)((long)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    local_40 = RNNBuilder::add_input
                         (&(this->rev_node_builder).super_RNNBuilder,&local_8c,
                          (this->h).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (uint)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start[uVar4]);
    local_8c = (this->rev_node_builder).super_RNNBuilder.cur;
  }
  local_70._M_array = &local_50;
  local_70._M_len = 2;
  local_60 = concatenate(&local_70,0);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back(local_78,&local_60);
  return local_60;
}

Assistant:

Expression BidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression fwd_embedding = fwd_node_builder.add_input(prev, x);
  prev = fwd_node_builder.state();
  for (unsigned child : children) {
    fwd_embedding = fwd_node_builder.add_input(prev, h[child]);
    prev = fwd_node_builder.state();
  }

  prev = (RNNPointer)(-1);
  Expression rev_embedding = rev_node_builder.add_input(prev, x);
  prev = rev_node_builder.state();
  for (unsigned i = children.size(); i-- > 0;) {
    unsigned  child = children[i];
    rev_embedding = rev_node_builder.add_input(prev, h[child]);
    prev = rev_node_builder.state();
  }

  Expression embedding = concatenate({fwd_embedding, rev_embedding});
  h.push_back(embedding);

  return embedding;
}